

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall
cmExtraEclipseCDT4Generator::WriteGroups
          (cmExtraEclipseCDT4Generator *this,
          vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups,string *linkName,
          cmXMLWriter *xml)

{
  bool bVar1;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups_00;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__x;
  string *inName;
  pointer this_00;
  pointer ppcVar2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sFiles;
  string local_90;
  string linkName4;
  string linkName3;
  
  for (this_00 = (sourceGroups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      this_00 !=
      (sourceGroups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl.
      super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    std::__cxx11::string::string((string *)&linkName3,(string *)linkName);
    std::__cxx11::string::append((char *)&linkName3);
    cmSourceGroup::GetFullName(this_00);
    std::__cxx11::string::append((char *)&linkName3);
    linkName4._M_dataplus._M_p._0_1_ = 0x5c;
    local_90._M_dataplus._M_p._0_1_ = 0x2f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )linkName3._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(linkName3._M_dataplus._M_p + linkName3._M_string_length),(char *)&linkName4,
               (char *)&local_90);
    std::__cxx11::string::string((string *)&linkName4,"virtual:/virtual",(allocator *)&local_90);
    AppendLinkedResource(xml,&linkName3,&linkName4,VirtualFolder);
    std::__cxx11::string::~string((string *)&linkName4);
    sourceGroups_00 = cmSourceGroup::GetGroupChildren(this_00);
    if ((sourceGroups_00->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl
        .super__Vector_impl_data._M_start !=
        (sourceGroups_00->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl
        .super__Vector_impl_data._M_finish) {
      WriteGroups(this,sourceGroups_00,linkName,xml);
    }
    __x = cmSourceGroup::GetSourceFiles(this_00);
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector(&sFiles,__x);
    for (ppcVar2 = sFiles.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppcVar2 !=
        sFiles.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppcVar2 = ppcVar2 + 1) {
      inName = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar2);
      bVar1 = cmsys::SystemTools::FileIsDirectory(inName);
      if (!bVar1) {
        std::__cxx11::string::string((string *)&linkName4,(string *)&linkName3);
        std::__cxx11::string::append((char *)&linkName4);
        cmsys::SystemTools::GetFilenameName(&local_90,inName);
        std::__cxx11::string::append((string *)&linkName4);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::string((string *)&local_90,(string *)inName);
        AppendLinkedResource(xml,&linkName4,&local_90,LinkToFile);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&linkName4);
      }
    }
    std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
              (&sFiles.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
    std::__cxx11::string::~string((string *)&linkName3);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::WriteGroups(
  std::vector<cmSourceGroup> const& sourceGroups, std::string& linkName,
  cmXMLWriter& xml)
{
  for (std::vector<cmSourceGroup>::const_iterator sgIt = sourceGroups.begin();
       sgIt != sourceGroups.end(); ++sgIt) {
    std::string linkName3 = linkName;
    linkName3 += "/";
    linkName3 += sgIt->GetFullName();

    std::replace(linkName3.begin(), linkName3.end(), '\\', '/');

    this->AppendLinkedResource(xml, linkName3, "virtual:/virtual",
                               VirtualFolder);
    std::vector<cmSourceGroup> const& children = sgIt->GetGroupChildren();
    if (!children.empty()) {
      this->WriteGroups(children, linkName, xml);
    }
    std::vector<const cmSourceFile*> sFiles = sgIt->GetSourceFiles();
    for (std::vector<const cmSourceFile*>::const_iterator fileIt =
           sFiles.begin();
         fileIt != sFiles.end(); ++fileIt) {
      std::string const& fullPath = (*fileIt)->GetFullPath();

      if (!cmSystemTools::FileIsDirectory(fullPath)) {
        std::string linkName4 = linkName3;
        linkName4 += "/";
        linkName4 += cmSystemTools::GetFilenameName(fullPath);
        this->AppendLinkedResource(xml, linkName4,
                                   this->GetEclipsePath(fullPath), LinkToFile);
      }
    }
  }
}